

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O0

size_t trc_print_ids(Curl_easy *data,char *buf,size_t maxlen)

{
  int iVar1;
  long local_38;
  curl_off_t cid;
  size_t maxlen_local;
  char *buf_local;
  Curl_easy *data_local;
  
  if (data->conn == (connectdata *)0x0) {
    local_38 = (data->state).recent_conn_id;
  }
  else {
    local_38 = data->conn->connection_id;
  }
  if (data->id < 0) {
    if (local_38 < 0) {
      iVar1 = curl_msnprintf(buf,maxlen,"[x-x] ");
      data_local = (Curl_easy *)(long)iVar1;
    }
    else {
      iVar1 = curl_msnprintf(buf,maxlen,"[x-%ld] ",local_38);
      data_local = (Curl_easy *)(long)iVar1;
    }
  }
  else if (local_38 < 0) {
    iVar1 = curl_msnprintf(buf,maxlen,"[%ld-x] ",data->id);
    data_local = (Curl_easy *)(long)iVar1;
  }
  else {
    iVar1 = curl_msnprintf(buf,maxlen,"[%ld-%ld] ",data->id,local_38);
    data_local = (Curl_easy *)(long)iVar1;
  }
  return (size_t)data_local;
}

Assistant:

static size_t trc_print_ids(struct Curl_easy *data, char *buf, size_t maxlen)
{
  curl_off_t cid = data->conn ?
                   data->conn->connection_id : data->state.recent_conn_id;
  if(data->id >= 0) {
    if(cid >= 0)
      return msnprintf(buf, maxlen, CURL_TRC_FMT_IDSDC, data->id, cid);
    else
      return msnprintf(buf, maxlen, CURL_TRC_FMT_IDSD, data->id);
  }
  else if(cid >= 0)
    return msnprintf(buf, maxlen, CURL_TRC_FMT_IDSC, cid);
  else {
    return msnprintf(buf, maxlen, "[x-x] ");
  }
}